

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_fwd_hrefk(jit_State *J)

{
  IRType1 *pIVar1;
  ushort uVar2;
  IRIns *J_00;
  ushort uVar3;
  AliasRet AVar4;
  int iVar5;
  TRef TVar6;
  ulong uVar7;
  
  uVar2 = (J->fold).left[0].field_0.op1;
  uVar3 = J->chain[0x3b];
  J_00 = (J->cur).ir;
  do {
    if (uVar3 <= uVar2) {
      if (*(char *)((long)J_00 + (ulong)uVar2 * 8 + 5) == 'R') {
        iVar5 = fwd_aa_tab_clear(J,(uint)uVar2,(uint)uVar2);
        if (iVar5 != 0) {
          pIVar1 = &(J->fold).ins.field_1.t;
          pIVar1->irt = pIVar1->irt & 0x7f;
        }
      }
LAB_0011bf70:
      TVar6 = lj_opt_cse(J);
      return TVar6;
    }
    uVar7 = (ulong)uVar3;
    if (uVar2 == J_00[uVar7].field_0.op1) {
      if ((J->fold).right[0].field_0.op1 == *(IRRef1 *)((long)J_00 + uVar7 * 8 + 2)) {
        iVar5 = fwd_aa_tab_clear(J,(uint)uVar3,(uint)uVar2);
        if (iVar5 != 0) {
          return (uint)uVar3;
        }
      }
      goto LAB_0011bf70;
    }
    AVar4 = aa_table((jit_State *)&J_00->field_0,(uint)uVar2,(uint)J_00[uVar7].field_0.op1);
    if (AVar4 != ALIAS_NO) goto LAB_0011bf70;
    uVar3 = *(ushort *)((long)J_00 + uVar7 * 8 + 6);
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_hrefk(jit_State *J)
{
  IRRef tab = fleft->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > tab) {
    IRIns *newref = IR(ref);
    if (tab == newref->op1) {
      if (fright->op1 == newref->op2 && fwd_aa_tab_clear(J, ref, tab))
	return ref;  /* Forward from NEWREF. */
      else
	goto docse;
    } else if (aa_table(J, tab, newref->op1) != ALIAS_NO) {
      goto docse;
    }
    ref = newref->prev;
  }
  /* No conflicting NEWREF: key location unchanged for HREFK of TDUP. */
  if (IR(tab)->o == IR_TDUP && fwd_aa_tab_clear(J, tab, tab))
    fins->t.irt &= ~IRT_GUARD;  /* Drop HREFK guard. */
docse:
  return CSEFOLD;
}